

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O1

void __thiscall cplus::lang::ByteArray::setSize(ByteArray *this,size_t size)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (this->bufferSize <= size) {
    pcVar2 = (char *)operator_new__(size);
    uVar3 = this->size;
    if (size <= this->size) {
      uVar3 = size;
    }
    if (uVar3 != 0) {
      pcVar1 = this->buffer;
      uVar4 = 0;
      do {
        pcVar2[uVar4] = pcVar1[uVar4];
        uVar4 = uVar4 + 1;
      } while (uVar3 != uVar4);
    }
    if (this->buffer != (char *)0x0) {
      operator_delete__(this->buffer);
    }
    this->buffer = pcVar2;
    this->bufferSize = size;
  }
  this->size = size;
  return;
}

Assistant:

void ByteArray::setSize(size_t size) {
			if (size < bufferSize) {
				this->size = size;
			} else {
				auto newBuffer = new char[size];
				auto minSize = (size < this->size) ? size : this->size;
				for (size_t index = 0; index < minSize; index++) {
					newBuffer[index] = buffer[index];
				}
				delete[] buffer;
				buffer = newBuffer;
				bufferSize = size;
				ByteArray::size = size;
			}
		}